

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

TCGArg do_constant_folding(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y)

{
  byte *pbVar1;
  uint64_t y_00;
  TCGTemp *ts1;
  TCGTemp *ts1_00;
  TCGTemp *ts2;
  TCGTemp *ts2_00;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  _Bool _Var7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  TCGCond c;
  TCGTemp *ts1_01;
  TCGArg unaff_RBP;
  TCGArg TVar12;
  undefined4 in_register_00000034;
  undefined8 *puVar13;
  ulong uVar14;
  undefined8 *x_00;
  TCGCond in_R8D;
  uint uVar15;
  
  puVar13 = (undefined8 *)CONCAT44(in_register_00000034,op);
  if (0x6f < op - INDEX_op_add_i32) {
switchD_00d54238_caseD_18:
    uVar14 = (ulong)op;
    do_constant_folding_cold_1();
    pbVar1 = (byte *)((TCGTemp *)y)->state_ptr;
    y_00 = *(uint64_t *)(pbVar1 + 0x18);
    if ((*ts1_01->state_ptr != '\x01') || (*pbVar1 != 1)) {
      _Var7 = ts_are_copies(ts1_01,(TCGTemp *)y);
      if (!_Var7) {
        if ((y_00 == 0 & *pbVar1) != 1) {
          return 2;
        }
        if (in_R8D == TCG_COND_LTU) {
          return 0;
        }
        return (ulong)(in_R8D != TCG_COND_GEU) + 1;
      }
      bVar6 = do_constant_folding_cond_eq(in_R8D);
      goto LAB_00d545a8;
    }
    x_00 = *(undefined8 **)((long)ts1_01->state_ptr + 0x18);
    if ((*(byte *)(*(long *)(uVar14 + 0x8168) + 0xc + ((ulong)puVar13 & 0xffffffff) * 0x20) & 0x10)
        != 0) {
      bVar6 = do_constant_folding_cond_64((uint64_t)x_00,y_00,in_R8D);
      goto LAB_00d545a8;
    }
    uVar11 = (uint)x_00;
    uVar10 = (uint)y_00;
    switch(in_R8D) {
    case TCG_COND_LT:
      bVar6 = (int)uVar11 < (int)uVar10;
      break;
    case TCG_COND_GE:
      bVar6 = (int)uVar10 <= (int)uVar11;
      break;
    case TCG_COND_LTU:
      bVar6 = uVar11 < uVar10;
      break;
    case TCG_COND_GEU:
      bVar6 = uVar10 <= uVar11;
      break;
    default:
      do_constant_folding_cond_cold_1();
      ts1 = (TCGTemp *)*x_00;
      ts1_00 = (TCGTemp *)x_00[1];
      ts2 = (TCGTemp *)*puVar13;
      ts2_00 = (TCGTemp *)puVar13[1];
      pcVar2 = (char *)ts2->state_ptr;
      if ((*pcVar2 != '\x01') || (pcVar3 = (char *)ts2_00->state_ptr, *pcVar3 != '\x01'))
      goto LAB_00d54688;
      uVar14 = *(long *)(pcVar3 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar2 + 0x18);
      pcVar2 = (char *)ts1->state_ptr;
      if ((*pcVar2 == '\x01') && (pcVar3 = (char *)ts1_00->state_ptr, *pcVar3 == '\x01')) {
        _Var7 = do_constant_folding_cond_64
                          (*(long *)(pcVar3 + 0x18) << 0x20 | (ulong)*(uint *)(pcVar2 + 0x18),uVar14
                           ,c);
        unaff_RBP = (TCGArg)_Var7;
LAB_00d54682:
        bVar6 = false;
      }
      else {
        if (uVar14 == 0) {
          if (c == TCG_COND_LTU) {
            unaff_RBP = 0;
          }
          else {
            if (c != TCG_COND_GEU) goto LAB_00d5466b;
            unaff_RBP = 1;
          }
          goto LAB_00d54682;
        }
LAB_00d5466b:
        bVar6 = true;
      }
      if (!bVar6) {
        return unaff_RBP;
      }
LAB_00d54688:
      _Var7 = ts_are_copies(ts1,ts2);
      TVar12 = 2;
      if ((_Var7) && (_Var7 = ts_are_copies(ts1_00,ts2_00), _Var7)) {
        _Var7 = do_constant_folding_cond_eq(c);
        TVar12 = (TCGArg)_Var7;
      }
      return TVar12;
    case TCG_COND_EQ:
      bVar6 = uVar11 == uVar10;
      break;
    case TCG_COND_NE:
      bVar6 = uVar11 != uVar10;
      break;
    case TCG_COND_LE:
      bVar6 = (int)uVar11 <= (int)uVar10;
      break;
    case TCG_COND_GT:
      bVar6 = (int)uVar10 < (int)uVar11;
      break;
    case TCG_COND_LEU:
      bVar6 = uVar11 <= uVar10;
      break;
    case TCG_COND_GTU:
      bVar6 = uVar10 < uVar11;
    }
LAB_00d545a8:
    return (ulong)bVar6;
  }
  in_R8D = 0xdd3bb0;
  uVar10 = (uint)x;
  uVar9 = (ushort)x;
  bVar8 = (byte)y;
  uVar11 = (uint)y;
  switch(op) {
  case INDEX_op_add_i32:
  case INDEX_op_add_i64:
    y = y + x;
    break;
  case INDEX_op_sub_i32:
  case INDEX_op_sub_i64:
    y = x - y;
    break;
  case INDEX_op_mul_i32:
  case INDEX_op_mul_i64:
    y = y * x;
    break;
  case INDEX_op_div_i32:
    uVar15 = 1;
    if (1 < uVar11) {
      uVar15 = uVar11;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | x & 0xffffffff) /
                   (long)(int)uVar15);
    break;
  case INDEX_op_divu_i32:
    uVar14 = 1;
    if (1 < uVar11) {
      uVar14 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) / uVar14;
    break;
  case INDEX_op_rem_i32:
    uVar15 = 1;
    if (1 < uVar11) {
      uVar15 = uVar11;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | x & 0xffffffff) %
                   (long)(int)uVar15);
    break;
  case INDEX_op_remu_i32:
    uVar14 = 1;
    if (1 < uVar11) {
      uVar14 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) % uVar14;
    break;
  default:
    goto switchD_00d54238_caseD_18;
  case INDEX_op_xor_i32:
  case INDEX_op_xor_i64:
    y = y ^ x;
    break;
  case INDEX_op_shl_i32:
    y = (TCGArg)(uVar10 << (bVar8 & 0x1f));
    break;
  case INDEX_op_shr_i32:
    y = (TCGArg)(uVar10 >> (bVar8 & 0x1f));
    break;
  case INDEX_op_sar_i32:
    x = (TCGArg)(uint)((int)uVar10 >> (bVar8 & 0x1f));
  case INDEX_op_ext_i32_i64:
  case INDEX_op_ext32s_i64:
    y = (long)(int)x;
    break;
  case INDEX_op_rotl_i32:
    y = (TCGArg)(uVar10 << (bVar8 & 0x1f) | uVar10 >> 0x20 - (bVar8 & 0x1f));
    break;
  case INDEX_op_rotr_i32:
    y = (TCGArg)(uVar10 >> (bVar8 & 0x1f) | uVar10 << 0x20 - (bVar8 & 0x1f));
    break;
  case INDEX_op_muluh_i32:
    y = (y & 0xffffffff) * (x & 0xffffffff) >> 0x20;
    break;
  case INDEX_op_mulsh_i32:
    y = (long)(int)uVar11 * (long)(int)uVar10 >> 0x20;
    break;
  case INDEX_op_ext8s_i32:
  case INDEX_op_ext8s_i64:
    y = (long)(char)x;
    break;
  case INDEX_op_ext16s_i32:
  case INDEX_op_ext16s_i64:
    y = (long)(short)uVar9;
    break;
  case INDEX_op_ext8u_i32:
  case INDEX_op_ext8u_i64:
    y = x & 0xff;
    break;
  case INDEX_op_bswap16_i32:
  case INDEX_op_bswap16_i64:
    x = (TCGArg)(ushort)(uVar9 << 8 | uVar9 >> 8);
  case INDEX_op_ext16u_i32:
  case INDEX_op_ext16u_i64:
    y = x & 0xffff;
    break;
  case INDEX_op_bswap32_i32:
  case INDEX_op_bswap32_i64:
    y = (TCGArg)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
                );
    break;
  case INDEX_op_not_i32:
  case INDEX_op_not_i64:
    y = ~x;
    break;
  case INDEX_op_neg_i32:
  case INDEX_op_neg_i64:
    y = -x;
    break;
  case INDEX_op_andc_i32:
  case INDEX_op_andc_i64:
    y = ~y;
  case INDEX_op_and_i32:
  case INDEX_op_and_i64:
    y = y & x;
    break;
  case INDEX_op_orc_i32:
  case INDEX_op_orc_i64:
    y = ~y;
  case INDEX_op_or_i32:
  case INDEX_op_or_i64:
    y = y | x;
    break;
  case INDEX_op_eqv_i32:
  case INDEX_op_eqv_i64:
    uVar14 = y ^ x;
    goto LAB_00d542c2;
  case INDEX_op_nand_i32:
  case INDEX_op_nand_i64:
    uVar14 = y & x;
    goto LAB_00d542c2;
  case INDEX_op_nor_i32:
  case INDEX_op_nor_i64:
    uVar14 = y | x;
LAB_00d542c2:
    y = ~uVar14;
    break;
  case INDEX_op_clz_i32:
    if (uVar10 != 0) {
      uVar11 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      y = (ulong)(uVar11 ^ 0x1f);
    }
    break;
  case INDEX_op_ctz_i32:
    if (uVar10 != 0) {
      uVar11 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      y = (ulong)uVar11;
    }
    break;
  case INDEX_op_ctpop_i32:
    uVar10 = uVar10 - ((uint)(x >> 1) & 0x55555555);
    uVar11 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    y = (ulong)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18);
    break;
  case INDEX_op_div_i64:
    y = (long)x / (long)(y + (y == 0));
    break;
  case INDEX_op_divu_i64:
    y = x / (y + (y == 0));
    break;
  case INDEX_op_rem_i64:
    y = (long)x % (long)(y + (y == 0));
    break;
  case INDEX_op_remu_i64:
    y = x % (y + (y == 0));
    break;
  case INDEX_op_shl_i64:
    y = x << (bVar8 & 0x3f);
    break;
  case INDEX_op_shr_i64:
    y = x >> (bVar8 & 0x3f);
    break;
  case INDEX_op_sar_i64:
    y = (long)x >> (bVar8 & 0x3f);
    break;
  case INDEX_op_rotl_i64:
    y = x << (bVar8 & 0x3f) | x >> 0x40 - (bVar8 & 0x3f);
    break;
  case INDEX_op_rotr_i64:
    y = x >> (bVar8 & 0x3f) | x << 0x40 - (bVar8 & 0x3f);
    break;
  case INDEX_op_extu_i32_i64:
  case INDEX_op_extrl_i64_i32:
  case INDEX_op_ext32u_i64:
    y = x & 0xffffffff;
    break;
  case INDEX_op_extrh_i64_i32:
    y = x >> 0x20;
    break;
  case INDEX_op_bswap64_i64:
    y = x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
        (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
        (x & 0xff00) << 0x28 | x << 0x38;
    break;
  case INDEX_op_clz_i64:
    uVar14 = 0x3f;
    if (x != 0) {
      for (; x >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    uVar14 = uVar14 ^ 0x3f;
    goto LAB_00d5443c;
  case INDEX_op_ctz_i64:
    uVar14 = 0;
    if (x != 0) {
      for (; (x >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
      }
    }
LAB_00d5443c:
    if (x != 0) {
      y = uVar14;
    }
    break;
  case INDEX_op_ctpop_i64:
    uVar14 = x - (x >> 1 & 0x5555555555555555);
    uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
    y = ((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    break;
  case INDEX_op_muluh_i64:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = y;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = x;
    y = SUB168(auVar4 * auVar5,8);
    break;
  case INDEX_op_mulsh_i64:
    y = SUB168(SEXT816((long)y) * SEXT816((long)x),8);
  }
  TVar12 = (long)(int)y;
  if ((s->tcg_op_defs[op].flags & 0x10) != 0) {
    TVar12 = y;
  }
  return TVar12;
}

Assistant:

static TCGArg do_constant_folding_2(TCGOpcode op, TCGArg x, TCGArg y)
{
    uint64_t l64, h64;

    switch (op) {
    CASE_OP_32_64(add):
        return x + y;

    CASE_OP_32_64(sub):
        return x - y;

    CASE_OP_32_64(mul):
        return x * y;

    CASE_OP_32_64(and):
        return x & y;

    CASE_OP_32_64(or):
        return x | y;

    CASE_OP_32_64(xor):
        return x ^ y;

    case INDEX_op_shl_i32:
        return (uint32_t)x << (y & 31);

    case INDEX_op_shl_i64:
        return (uint64_t)x << (y & 63);

    case INDEX_op_shr_i32:
        return (uint32_t)x >> (y & 31);

    case INDEX_op_shr_i64:
        return (uint64_t)x >> (y & 63);

    case INDEX_op_sar_i32:
        return (int32_t)x >> (y & 31);

    case INDEX_op_sar_i64:
        return (int64_t)x >> (y & 63);

    case INDEX_op_rotr_i32:
        return ror32(x, y & 31);

    case INDEX_op_rotr_i64:
        return ror64(x, y & 63);

    case INDEX_op_rotl_i32:
        return rol32(x, y & 31);

    case INDEX_op_rotl_i64:
        return rol64(x, y & 63);

    CASE_OP_32_64(not):
        return ~x;

    CASE_OP_32_64(neg):
#ifdef _MSC_VER
        return (0 - x);
#else
        return -x;
#endif

    CASE_OP_32_64(andc):
        return x & ~y;

    CASE_OP_32_64(orc):
        return x | ~y;

    CASE_OP_32_64(eqv):
        return ~(x ^ y);

    CASE_OP_32_64(nand):
        return ~(x & y);

    CASE_OP_32_64(nor):
        return ~(x | y);

    case INDEX_op_clz_i32:
        return (uint32_t)x ? clz32(x) : y;

    case INDEX_op_clz_i64:
        return x ? clz64(x) : y;

    case INDEX_op_ctz_i32:
        return (uint32_t)x ? ctz32(x) : y;

    case INDEX_op_ctz_i64:
        return x ? ctz64(x) : y;

    case INDEX_op_ctpop_i32:
        return ctpop32(x);

    case INDEX_op_ctpop_i64:
        return ctpop64(x);

    CASE_OP_32_64(ext8s):
        return (int8_t)x;

    CASE_OP_32_64(ext16s):
        return (int16_t)x;

    CASE_OP_32_64(ext8u):
        return (uint8_t)x;

    CASE_OP_32_64(ext16u):
        return (uint16_t)x;

    CASE_OP_32_64(bswap16):
        return bswap16(x);

    CASE_OP_32_64(bswap32):
        return bswap32(x);

    case INDEX_op_bswap64_i64:
        return bswap64(x);

    case INDEX_op_ext_i32_i64:
    case INDEX_op_ext32s_i64:
        return (int32_t)x;

    case INDEX_op_extu_i32_i64:
    case INDEX_op_extrl_i64_i32:
    case INDEX_op_ext32u_i64:
        return (uint32_t)x;

    case INDEX_op_extrh_i64_i32:
        return (uint64_t)x >> 32;

    case INDEX_op_muluh_i32:
        return ((uint64_t)(uint32_t)x * (uint32_t)y) >> 32;
    case INDEX_op_mulsh_i32:
        return ((int64_t)(int32_t)x * (int32_t)y) >> 32;

    case INDEX_op_muluh_i64:
        mulu64(&l64, &h64, x, y);
        return h64;
    case INDEX_op_mulsh_i64:
        muls64(&l64, &h64, x, y);
        return h64;

    case INDEX_op_div_i32:
        /* Avoid crashing on divide by zero, otherwise undefined.  */
        return (int32_t)x / ((int32_t)y ? (int32_t)y : 1);
    case INDEX_op_divu_i32:
        return (uint32_t)x / ((uint32_t)y ? (uint32_t)y : 1);
    case INDEX_op_div_i64:
        return (int64_t)x / ((int64_t)y ? (int64_t)y : 1);
    case INDEX_op_divu_i64:
        return (uint64_t)x / ((uint64_t)y ? (uint64_t)y : 1);

    case INDEX_op_rem_i32:
        return (int32_t)x % ((int32_t)y ? (int32_t)y : 1);
    case INDEX_op_remu_i32:
        return (uint32_t)x % ((uint32_t)y ? (uint32_t)y : 1);
    case INDEX_op_rem_i64:
        return (int64_t)x % ((int64_t)y ? (int64_t)y : 1);
    case INDEX_op_remu_i64:
        return (uint64_t)x % ((uint64_t)y ? (uint64_t)y : 1);

    default:
        fprintf(stderr,
                "Unrecognized operation %d in do_constant_folding.\n", op);
        tcg_abort();
    }
}